

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O2

void __thiscall Assimp::ASEImporter::AddMeshes(ASEImporter *this,BaseNode *snode,aiNode *node)

{
  aiColor4D *paVar1;
  aiMesh *paVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  uint i;
  ulong uVar6;
  uint *puVar7;
  BaseNode *pBVar8;
  aiVector3t<float> *paVar9;
  uint uVar10;
  long lVar11;
  aiVector3t<float> aVar12;
  aiMatrix3x3 m3;
  aiMatrix4x4 m;
  aiMatrix3x3t<float> local_b4;
  BaseNode *local_90;
  aiNode *local_88;
  aiMatrix4x4t<float> *local_80;
  aiMatrix4x4t<float> local_78;
  
  for (uVar6 = 0; uVar6 < this->pcScene->mNumMeshes; uVar6 = uVar6 + 1) {
    paVar1 = this->pcScene->mMeshes[uVar6]->mColors[2];
    pBVar8 = (BaseNode *)&paVar1[4].b;
    if (paVar1 == (aiColor4D *)0x0) {
      pBVar8 = (BaseNode *)0x0;
    }
    if (pBVar8 == snode) {
      node->mNumMeshes = node->mNumMeshes + 1;
    }
  }
  if ((ulong)node->mNumMeshes != 0) {
    puVar7 = (uint *)operator_new__((ulong)node->mNumMeshes << 2);
    node->mMeshes = puVar7;
    uVar10 = 0;
    local_90 = snode;
    local_88 = node;
    for (uVar6 = 0; uVar6 < this->pcScene->mNumMeshes; uVar6 = uVar6 + 1) {
      paVar2 = this->pcScene->mMeshes[uVar6];
      paVar1 = paVar2->mColors[2];
      pBVar8 = (BaseNode *)&paVar1[4].b;
      if (paVar1 == (aiColor4D *)0x0) {
        pBVar8 = (BaseNode *)0x0;
      }
      if (pBVar8 == snode) {
        node->mMeshes[uVar10] = (uint)uVar6;
        local_80 = (aiMatrix4x4t<float> *)(paVar1 + 9);
        local_78.a1 = paVar1[9].r;
        local_78.a2 = paVar1[9].g;
        local_78.a3 = paVar1[9].b;
        local_78.a4 = paVar1[9].a;
        local_78.b1 = paVar1[10].r;
        local_78.b2 = paVar1[10].g;
        local_78.b3 = paVar1[10].b;
        local_78.b4 = paVar1[10].a;
        local_78.c1 = paVar1[0xb].r;
        local_78.c2 = paVar1[0xb].g;
        local_78.c3 = paVar1[0xb].b;
        local_78.c4 = paVar1[0xb].a;
        local_78.d1 = paVar1[0xc].r;
        local_78.d2 = paVar1[0xc].g;
        local_78.d3 = paVar1[0xc].b;
        local_78.d4 = paVar1[0xc].a;
        aiMatrix4x4t<float>::Inverse(&local_78);
        paVar9 = paVar2->mVertices;
        for (lVar11 = (ulong)paVar2->mNumVertices * 0xc; snode = local_90, lVar11 != 0;
            lVar11 = lVar11 + -0xc) {
          aVar12 = ::operator*(&local_78,paVar9);
          paVar9->x = (float)(int)aVar12._0_8_;
          paVar9->y = (float)(int)((ulong)aVar12._0_8_ >> 0x20);
          paVar9->z = aVar12.z;
          paVar9 = paVar9 + 1;
        }
        if (paVar2->mNormals != (aiVector3D *)0x0) {
          aiMatrix3x3t<float>::aiMatrix3x3t(&local_b4,local_80);
          fVar5 = local_b4.b3;
          fVar4 = local_b4.a3;
          fVar3 = local_b4.a2;
          local_b4.a2 = local_b4.b1;
          local_b4.b1 = fVar3;
          local_b4.a3 = local_b4.c1;
          local_b4.c1 = fVar4;
          local_b4.b3 = local_b4.c2;
          local_b4.c2 = fVar5;
          paVar9 = paVar2->mNormals;
          for (lVar11 = (ulong)paVar2->mNumVertices * 0xc; lVar11 != 0; lVar11 = lVar11 + -0xc) {
            aVar12 = ::operator*(&local_b4,paVar9);
            paVar9->x = (float)(int)aVar12._0_8_;
            paVar9->y = (float)(int)((ulong)aVar12._0_8_ >> 0x20);
            paVar9->z = aVar12.z;
            paVar9 = paVar9 + 1;
          }
        }
        uVar10 = uVar10 + 1;
        node = local_88;
      }
    }
  }
  return;
}

Assistant:

void ASEImporter::AddMeshes(const ASE::BaseNode* snode,aiNode* node)
{
    for (unsigned int i = 0; i < pcScene->mNumMeshes;++i)   {
        // Get the name of the mesh (the mesh instance has been temporarily stored in the third vertex color)
        const aiMesh* pcMesh  = pcScene->mMeshes[i];
        const ASE::Mesh* mesh = (const ASE::Mesh*)pcMesh->mColors[2];

        if (mesh == snode) {
            ++node->mNumMeshes;
        }
    }

    if(node->mNumMeshes)    {
        node->mMeshes = new unsigned int[node->mNumMeshes];
        for (unsigned int i = 0, p = 0; i < pcScene->mNumMeshes;++i)    {

            const aiMesh* pcMesh  = pcScene->mMeshes[i];
            const ASE::Mesh* mesh = (const ASE::Mesh*)pcMesh->mColors[2];
            if (mesh == snode)  {
                node->mMeshes[p++] = i;

                // Transform all vertices of the mesh back into their local space ->
                // at the moment they are pretransformed
                aiMatrix4x4 m  = mesh->mTransform;
                m.Inverse();

                aiVector3D* pvCurPtr = pcMesh->mVertices;
                const aiVector3D* pvEndPtr = pvCurPtr + pcMesh->mNumVertices;
                while (pvCurPtr != pvEndPtr)    {
                    *pvCurPtr = m * (*pvCurPtr);
                    pvCurPtr++;
                }

                // Do the same for the normal vectors, if we have them.
                // As always, inverse transpose.
                if (pcMesh->mNormals)   {
                    aiMatrix3x3 m3 = aiMatrix3x3( mesh->mTransform );
                    m3.Transpose();

                    pvCurPtr = pcMesh->mNormals;
                    pvEndPtr = pvCurPtr + pcMesh->mNumVertices;
                    while (pvCurPtr != pvEndPtr)    {
                        *pvCurPtr = m3 * (*pvCurPtr);
                        pvCurPtr++;
                    }
                }
            }
        }
    }
}